

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_secp256k1.cpp
# Opt level: O1

ByteData * __thiscall
cfd::core::Secp256k1::AddTweakPubkeySecp256k1Ec
          (ByteData *__return_storage_ptr__,Secp256k1 *this,ByteData *pubkey,ByteData *tweak,
          bool is_tweak_check)

{
  secp256k1_context *ctx;
  int iVar1;
  value_type_conflict *__val;
  size_t sVar2;
  CfdException *pCVar3;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_data;
  size_t byte_size;
  secp256k1_pubkey tweaked2;
  secp256k1_pubkey tweaked;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tweak_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_data;
  secp256k1_pubkey maybe_tweaked2;
  secp256k1_pubkey watchman;
  secp256k1_pubkey *pubkey_combined [2];
  int local_1ac;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1a8;
  size_t local_190;
  undefined1 local_188 [64];
  undefined1 local_148 [32];
  undefined1 local_128 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  uchar local_108 [8];
  uchar auStack_100 [8];
  uchar local_f8 [8];
  uchar auStack_f0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d0;
  undefined1 local_b8 [64];
  char *local_78 [2];
  char *local_68;
  uchar auStack_60 [8];
  uchar local_58 [8];
  uchar auStack_50 [8];
  uchar local_48 [8];
  uchar auStack_40 [8];
  secp256k1_pubkey *local_38;
  secp256k1_pubkey *local_30;
  
  ctx = (secp256k1_context *)this->secp256k1_context_;
  if (ctx == (secp256k1_context *)0x0) {
    local_128._0_8_ = "cfdcore_secp256k1.cpp";
    local_128._8_4_ = 0xe8;
    local_118._M_allocated_capacity = 0x59cfef;
    logger::log<>((CfdSourceLocation *)local_128,kCfdLogLevelWarning,"Secp256k1 context is NULL.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_128._0_8_ = &local_118;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"Secp256k1 context is NULL.","");
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_128);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar2 = ByteData::GetDataSize(pubkey);
  if (sVar2 != 0x21) {
    local_128._0_8_ = "cfdcore_secp256k1.cpp";
    local_128._8_4_ = 0xed;
    local_118._M_allocated_capacity = 0x59cfef;
    logger::log<>((CfdSourceLocation *)local_128,kCfdLogLevelWarning,"Invalid Argument pubkey size."
                 );
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_128._0_8_ = &local_118;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"Invalid Pubkey size.","")
    ;
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_128);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar2 = ByteData::GetDataSize(tweak);
  if (sVar2 != 0x20) {
    local_128._0_8_ = "cfdcore_secp256k1.cpp";
    local_128._8_4_ = 0xf2;
    local_118._M_allocated_capacity = 0x59cfef;
    logger::log<>((CfdSourceLocation *)local_128,kCfdLogLevelWarning,"Invalid Argument tweak size.")
    ;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_128._0_8_ = &local_118;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"Invalid tweak size.","");
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_128);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::GetBytes(&local_d0,pubkey);
  ByteData::GetBytes(&local_e8,tweak);
  local_1ac = secp256k1_ec_pubkey_parse
                        (ctx,(secp256k1_pubkey *)local_128,
                         local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         (long)local_d0.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_d0.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
  if (local_1ac != 1) {
    local_188._0_8_ = "cfdcore_secp256k1.cpp";
    local_188._8_4_ = 0xff;
    local_188._16_8_ = "AddTweakPubkeySecp256k1Ec";
    logger::log<int&>((CfdSourceLocation *)local_188,kCfdLogLevelWarning,
                      "secp256k1_ec_pubkey_parse Error.({})",&local_1ac);
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_188._0_8_ = local_188 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_188,"Secp256k1 pubkey parse Error.","");
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_188);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_48[0] = local_f8[0];
  local_48[1] = local_f8[1];
  local_48[2] = local_f8[2];
  local_48[3] = local_f8[3];
  local_48[4] = local_f8[4];
  local_48[5] = local_f8[5];
  local_48[6] = local_f8[6];
  local_48[7] = local_f8[7];
  auStack_40[0] = auStack_f0[0];
  auStack_40[1] = auStack_f0[1];
  auStack_40[2] = auStack_f0[2];
  auStack_40[3] = auStack_f0[3];
  auStack_40[4] = auStack_f0[4];
  auStack_40[5] = auStack_f0[5];
  auStack_40[6] = auStack_f0[6];
  auStack_40[7] = auStack_f0[7];
  local_58[0] = local_108[0];
  local_58[1] = local_108[1];
  local_58[2] = local_108[2];
  local_58[3] = local_108[3];
  local_58[4] = local_108[4];
  local_58[5] = local_108[5];
  local_58[6] = local_108[6];
  local_58[7] = local_108[7];
  auStack_50[0] = auStack_100[0];
  auStack_50[1] = auStack_100[1];
  auStack_50[2] = auStack_100[2];
  auStack_50[3] = auStack_100[3];
  auStack_50[4] = auStack_100[4];
  auStack_50[5] = auStack_100[5];
  auStack_50[6] = auStack_100[6];
  auStack_50[7] = auStack_100[7];
  local_68 = (char *)local_118._M_allocated_capacity;
  auStack_60[0] = local_118._M_local_buf[8];
  auStack_60[1] = local_118._M_local_buf[9];
  auStack_60[2] = local_118._M_local_buf[10];
  auStack_60[3] = local_118._M_local_buf[0xb];
  auStack_60[4] = local_118._M_local_buf[0xc];
  auStack_60[5] = local_118._M_local_buf[0xd];
  auStack_60[6] = local_118._M_local_buf[0xe];
  auStack_60[7] = local_118._M_local_buf[0xf];
  local_78[0] = (char *)local_128._0_8_;
  local_1ac = secp256k1_ec_pubkey_tweak_add
                        (ctx,(secp256k1_pubkey *)local_128,
                         local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start);
  if (local_1ac != 1) {
    local_188._0_8_ = "cfdcore_secp256k1.cpp";
    local_188._8_4_ = 0x107;
    local_188._16_8_ = "AddTweakPubkeySecp256k1Ec";
    logger::log<int&>((CfdSourceLocation *)local_188,kCfdLogLevelWarning,
                      "secp256k1_ec_pubkey_tweak_add Error.({})",&local_1ac);
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_188._0_8_ = local_188 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_188,"Secp256k1 pubkey tweak Error.","");
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_188);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x41);
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + 0x41;
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x30] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x31] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x32] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x33] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x34] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x35] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x36] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x37] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x38] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x39] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3a] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3b] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3c] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3d] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3e] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3f] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x20] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x21] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x22] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x23] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x24] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x25] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x26] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x27] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x28] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x29] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2a] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2b] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2c] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2d] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2e] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2f] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x10] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x11] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x12] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x13] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x14] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x15] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x16] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x17] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x18] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x19] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1a] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1b] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1c] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1d] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1e] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1f] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[4] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[5] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[6] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[7] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[8] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[9] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[10] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xe] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xf] = '\0';
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x40] = '\0';
  local_190 = 0x41;
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1ac = secp256k1_ec_pubkey_serialize
                        (ctx,local_1a8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,&local_190,
                         (secp256k1_pubkey *)local_128,0x102);
  if (local_1ac != 1) {
    local_188._0_8_ = "cfdcore_secp256k1.cpp";
    local_188._8_4_ = 0x112;
    local_188._16_8_ = "AddTweakPubkeySecp256k1Ec";
    logger::log<int&>((CfdSourceLocation *)local_188,kCfdLogLevelWarning,
                      "secp256k1_ec_pubkey_serialize Error.({})",&local_1ac);
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_188._0_8_ = local_188 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_188,"Secp256k1 pubkey serialize Error.","");
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_188);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (local_190 != 0x21) {
    local_188._0_8_ = "cfdcore_secp256k1.cpp";
    local_188._8_4_ = 0x11a;
    local_188._16_8_ = "AddTweakPubkeySecp256k1Ec";
    logger::log<unsigned_long&>
              ((CfdSourceLocation *)local_188,kCfdLogLevelWarning,
               "secp256k1_ec_pubkey_serialize pubkey length Error.({})",&local_190);
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_188._0_8_ = local_188 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_188,"Secp256k1 pubkey length Error.","");
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_188);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_1a8,0x21);
  if (is_tweak_check) {
    local_1ac = secp256k1_ec_pubkey_create
                          (ctx,(secp256k1_pubkey *)local_188,
                           local_e8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
    if (local_1ac != 1) {
      local_b8._0_8_ = "cfdcore_secp256k1.cpp";
      local_b8._8_4_ = 0x126;
      local_b8._16_8_ = "AddTweakPubkeySecp256k1Ec";
      logger::log<int&>((CfdSourceLocation *)local_b8,kCfdLogLevelWarning,
                        "secp256k1_ec_pubkey_parse Error.({})",&local_1ac);
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      local_b8._0_8_ = local_b8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,"Secp256k1 pubkey parse Error.","");
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_b8);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_1ac = secp256k1_ec_pubkey_negate(ctx,(secp256k1_pubkey *)local_78);
    if (local_1ac != 1) {
      local_b8._0_8_ = "cfdcore_secp256k1.cpp";
      local_b8._8_4_ = 300;
      local_b8._16_8_ = "AddTweakPubkeySecp256k1Ec";
      logger::log<int&>((CfdSourceLocation *)local_b8,kCfdLogLevelWarning,
                        "secp256k1_ec_pubkey_negate Error.({})",&local_1ac);
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      local_b8._0_8_ = local_b8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,"Secp256k1 pubkey negate Error.","");
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_b8);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_38 = (secp256k1_pubkey *)local_78;
    local_30 = (secp256k1_pubkey *)local_128;
    local_1ac = secp256k1_ec_pubkey_combine(ctx,(secp256k1_pubkey *)local_b8,&local_38,2);
    if (local_1ac != 1) {
      local_148._0_8_ = "cfdcore_secp256k1.cpp";
      local_148._8_4_ = 0x139;
      local_148._16_8_ = "AddTweakPubkeySecp256k1Ec";
      logger::log<int&>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,
                        "secp256k1_ec_pubkey_combine Error.({})",&local_1ac);
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = local_148 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"Secp256k1 pubkey combine Error.","");
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    iVar1 = bcmp(local_b8,local_188,0x40);
    if (iVar1 != 0) {
      local_148._0_8_ = "cfdcore_secp256k1.cpp";
      local_148._8_4_ = 0x13f;
      local_148._16_8_ = "AddTweakPubkeySecp256k1Ec";
      logger::log<>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"tweak check Error.");
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = local_148 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"Secp256k1 tweak check Error.","");
      CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)local_148);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  ByteData::ByteData(__return_storage_ptr__,&local_1a8);
  if (local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData Secp256k1::AddTweakPubkeySecp256k1Ec(
    const ByteData& pubkey, const ByteData& tweak, bool is_tweak_check) {
  secp256k1_context* context =
      static_cast<secp256k1_context*>(secp256k1_context_);

  if (secp256k1_context_ == NULL) {
    warn(CFD_LOG_SOURCE, "Secp256k1 context is NULL.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 context is NULL.");
  }
  if (pubkey.GetDataSize() != kCompressedPubkeyByteSize) {
    warn(CFD_LOG_SOURCE, "Invalid Argument pubkey size.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid Pubkey size.");
  }
  if (tweak.GetDataSize() != kTweakByteSize) {
    warn(CFD_LOG_SOURCE, "Invalid Argument tweak size.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid tweak size.");
  }

  int ret;
  std::vector<uint8_t> pubkey_data = pubkey.GetBytes();
  std::vector<uint8_t> tweak_data = tweak.GetBytes();
  secp256k1_pubkey tweaked;
  secp256k1_pubkey watchman;
  ret = secp256k1_ec_pubkey_parse(
      context, &tweaked, pubkey_data.data(), pubkey_data.size());
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "secp256k1_ec_pubkey_parse Error.({})", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 pubkey parse Error.");
  }
  memcpy(&watchman, &tweaked, sizeof(watchman));

  ret = secp256k1_ec_pubkey_tweak_add(context, &tweaked, tweak_data.data());
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "secp256k1_ec_pubkey_tweak_add Error.({})", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 pubkey tweak Error.");
  }

  std::vector<uint8_t> byte_data(kFullPubkeyByteSize);
  size_t byte_size = byte_data.size();
  ret = secp256k1_ec_pubkey_serialize(
      context, byte_data.data(), &byte_size, &tweaked,
      SECP256K1_EC_COMPRESSED);
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "secp256k1_ec_pubkey_serialize Error.({})", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 pubkey serialize Error.");
  }

  if (byte_size != kCompressedPubkeyByteSize) {
    warn(
        CFD_LOG_SOURCE,
        "secp256k1_ec_pubkey_serialize pubkey length Error.({})", byte_size);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 pubkey length Error.");
  }
  byte_data.resize(byte_size);

  if (is_tweak_check) {
    // check: `tweaked - watchman = tweak`
    secp256k1_pubkey tweaked2;
    ret = secp256k1_ec_pubkey_create(context, &tweaked2, tweak_data.data());
    if (ret != 1) {
      warn(CFD_LOG_SOURCE, "secp256k1_ec_pubkey_parse Error.({})", ret);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Secp256k1 pubkey parse Error.");
    }
    ret = secp256k1_ec_pubkey_negate(context, &watchman);
    if (ret != 1) {
      warn(CFD_LOG_SOURCE, "secp256k1_ec_pubkey_negate Error.({})", ret);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Secp256k1 pubkey negate Error.");
    }

    secp256k1_pubkey* pubkey_combined[2];
    pubkey_combined[0] = &watchman;
    pubkey_combined[1] = &tweaked;
    secp256k1_pubkey maybe_tweaked2;
    ret = secp256k1_ec_pubkey_combine(
        context, &maybe_tweaked2, pubkey_combined, 2);
    if (ret != 1) {
      warn(CFD_LOG_SOURCE, "secp256k1_ec_pubkey_combine Error.({})", ret);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Secp256k1 pubkey combine Error.");
    }
    if (memcmp(&maybe_tweaked2, &tweaked2, 64) != 0) {
      warn(CFD_LOG_SOURCE, "tweak check Error.");
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Secp256k1 tweak check Error.");
    }
  }
  return ByteData(byte_data);
}